

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

void __thiscall UniValue::checkType(UniValue *this,VType *expected)

{
  undefined8 uVar1;
  type_error *this_00;
  int *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff00;
  VType t;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined3 in_stack_ffffffffffffff30;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff34;
  allocator<char> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 local_aa [162];
  long local_8;
  
  t = (VType)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)&(in_RDI->_M_dataplus)._M_p == *in_RSI) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else {
    uVar3 = CONCAT13(1,in_stack_ffffffffffffff30);
    this_01 = in_RDI;
    uVar1 = __cxa_allocate_exception(0x10);
    uvTypeName(t);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_aa + 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)in_RSI,in_stack_ffffffffffffff38);
    std::operator+((char *)__lhs,in_stack_ffffffffffffff08);
    std::operator+(__lhs,(char *)in_stack_ffffffffffffff08);
    this_00 = (type_error *)uvTypeName(t);
    psVar2 = (string *)local_aa;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)in_RSI,in_stack_ffffffffffffff38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff34,uVar3),in_RDI);
    type_error::runtime_error(this_00,psVar2);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(uVar1,&type_error::typeinfo,type_error::~type_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::checkType(const VType& expected) const
{
    if (typ != expected) {
        throw type_error{"JSON value of type " + std::string{uvTypeName(typ)} + " is not of expected type " +
                                 std::string{uvTypeName(expected)}};
    }
}